

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O3

error_code llvm::errorToErrorCode(Error *Err)

{
  ErrorInfoBase *pEVar1;
  _func_int **pp_Var2;
  __uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> _Var3;
  int iVar4;
  _func_int *p_Var5;
  _Head_base<0UL,_llvm::ErrorInfoBase_*,_false> _Var6;
  Error EVar7;
  _func_int **pp_Var8;
  undefined1 local_78 [8];
  error_code EC;
  anon_class_8_1_3fcf615c local_60;
  Error local_58;
  _Head_base<0UL,_llvm::ErrorInfoBase_*,_false> local_50;
  _Head_base<0UL,_llvm::ErrorInfoBase_*,_false> local_48;
  __uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> local_40;
  Error local_38;
  
  local_78._0_4_ = 0;
  EC._0_8_ = std::_V2::system_category();
  pEVar1 = Err->Payload;
  Err->Payload = (ErrorInfoBase *)0x0;
  _Var6._M_head_impl = (ErrorInfoBase *)((ulong)pEVar1 & 0xfffffffffffffffe);
  local_60.EC = (error_code *)local_78;
  if (_Var6._M_head_impl == (ErrorInfoBase *)0x0) {
    local_38.Payload = (ErrorInfoBase *)0x1;
  }
  else {
    iVar4 = (*(_Var6._M_head_impl)->_vptr_ErrorInfoBase[6])(_Var6._M_head_impl);
    if ((char)iVar4 == '\0') {
      local_40._M_t.
      super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
      super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl =
           (tuple<llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>)
           (tuple<llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>)
           _Var6._M_head_impl;
      handleErrorImpl<llvm::errorToErrorCode(llvm::Error)::__0>
                ((llvm *)&local_38,
                 (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                 &local_40,&local_60);
      if ((_Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>)
          local_40._M_t.
          super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
          super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl == (ErrorInfoBase *)0x0)
      goto LAB_00d95493;
      p_Var5 = *(_func_int **)
                local_40._M_t.
                super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>
                .super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl;
      _Var6._M_head_impl =
           (ErrorInfoBase *)
           local_40._M_t.
           super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
           super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl;
    }
    else {
      local_38.Payload = (ErrorInfoBase *)0x1;
      pp_Var8 = _Var6._M_head_impl[1]._vptr_ErrorInfoBase;
      pp_Var2 = _Var6._M_head_impl[2]._vptr_ErrorInfoBase;
      EVar7.Payload = local_38.Payload;
      if (pp_Var8 != pp_Var2) {
        EVar7.Payload = (ErrorInfoBase *)0x1;
        local_48._M_head_impl = _Var6._M_head_impl;
        do {
          local_50._M_head_impl = (ErrorInfoBase *)*pp_Var8;
          *pp_Var8 = (_func_int *)0x0;
          local_58.Payload = EVar7.Payload;
          handleErrorImpl<llvm::errorToErrorCode(llvm::Error)::__0>
                    ((llvm *)&EC._M_cat,
                     (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                     &local_50,&local_60);
          ErrorList::join((ErrorList *)&local_40,&local_58,(Error *)&EC._M_cat);
          _Var3._M_t.
          super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
          super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl =
               local_40._M_t.
               super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>
               .super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl;
          local_40._M_t.
          super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
          super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl =
               (tuple<llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>)
               (_Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>)
               0x0;
          if ((long *)((ulong)EC._M_cat & 0xfffffffffffffffe) != (long *)0x0) {
            (**(code **)(*(long *)((ulong)EC._M_cat & 0xfffffffffffffffe) + 8))();
          }
          if (local_50._M_head_impl != (ErrorInfoBase *)0x0) {
            (*(local_50._M_head_impl)->_vptr_ErrorInfoBase[1])();
          }
          local_50._M_head_impl = (ErrorInfoBase *)0x0;
          if ((long *)((ulong)local_58.Payload & 0xfffffffffffffffe) != (long *)0x0) {
            (**(code **)(*(long *)((ulong)local_58.Payload & 0xfffffffffffffffe) + 8))();
          }
          EVar7.Payload =
               (ErrorInfoBase *)
               ((ulong)_Var3._M_t.
                       super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>
                       .super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl | 1);
          pp_Var8 = pp_Var8 + 1;
          _Var6._M_head_impl = local_48._M_head_impl;
        } while (pp_Var8 != pp_Var2);
      }
      local_38.Payload = EVar7.Payload;
      p_Var5 = *(_func_int **)_Var6._M_head_impl;
    }
    (**(code **)(p_Var5 + 8))(_Var6._M_head_impl);
  }
LAB_00d95493:
  cantFail(&local_38,(char *)0x0);
  if ((long *)((ulong)local_38.Payload & 0xfffffffffffffffe) != (long *)0x0) {
    (**(code **)(*(long *)((ulong)local_38.Payload & 0xfffffffffffffffe) + 8))();
  }
  llvm_unreachable_internal
            ("inconvertible error code",
             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/Error.cpp"
             ,0x4f);
}

Assistant:

std::error_code errorToErrorCode(Error Err) {
  std::error_code EC;
  handleAllErrors(std::move(Err), [&](const ErrorInfoBase &EI) {
    EC = EI.convertToErrorCode();
  });
  if (EC == inconvertibleErrorCode())
    report_fatal_error(EC.message());
  return EC;
}